

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<bool>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<bool> *this,bool *fallback)

{
  bool *fallback_local;
  TypedAttributeWithFallback<bool> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  nonstd::optional_lite::optional<bool>::optional(&this->_attrib);
  this->_empty = false;
  this->_fallback = (bool)(*fallback & 1);
  this->_blocked = false;
  return;
}

Assistant:

TypedAttributeWithFallback(const T &fallback) : _fallback(fallback) {}